

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O3

void dlep_extension_add(dlep_extension *ext)

{
  list_entity *plVar1;
  uint16_t *puVar2;
  list_entity *plVar3;
  ushort uVar4;
  ushort uVar5;
  
  if (((ext->_node).list.next != (list_entity *)0x0) &&
     ((ext->_node).list.prev != (list_entity *)0x0)) {
    return;
  }
  (ext->_node).key = ext;
  avl_insert(&_extension_tree,&ext->_node);
  puVar2 = (uint16_t *)realloc(_id_array,(ulong)_extension_tree.count * 2);
  plVar1 = _extension_tree.list_head.prev;
  if (puVar2 != (uint16_t *)0x0) {
    _id_array_length = 0;
    _id_array = puVar2;
    if ((_extension_tree.list_head.next)->prev != _extension_tree.list_head.prev) {
      uVar4 = 0;
      plVar3 = _extension_tree.list_head.next;
      do {
        if (*(uint *)&plVar3[-9].next < 0x10000) {
          uVar5 = (ushort)*(uint *)&plVar3[-9].next;
          puVar2[uVar4] = uVar5 << 8 | uVar5 >> 8;
          uVar4 = uVar4 + 1;
          _id_array_length = uVar4;
        }
        plVar3 = plVar3->next;
      } while (plVar3->prev != plVar1);
    }
  }
  return;
}

Assistant:

void
dlep_extension_add(struct dlep_extension *ext) {
  uint16_t *ptr;

  if (avl_is_node_added(&ext->_node)) {
    return;
  }

  /* add to tree */
  ext->_node.key = &ext->id;
  avl_insert(&_extension_tree, &ext->_node);

  /* refresh id array */
  ptr = realloc(_id_array, sizeof(uint16_t) * _extension_tree.count);
  if (!ptr) {
    return;
  }

  _id_array_length = 0;
  _id_array = ptr;

  avl_for_each_element(&_extension_tree, ext, _node) {
    if (ext->id >= 0 && ext->id <= 0xffff) {
      ptr[_id_array_length] = htons(ext->id);
      _id_array_length++;
    }
  }
}